

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>::Swap
          (RepeatedFieldPrimitiveAccessor<unsigned_int> *this,Field *data,
          RepeatedFieldAccessor *other_mutator,Field *other_data)

{
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/reflection_internal.h"
               ,0x11f);
    other = LogMessage::operator<<(&local_60,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  RepeatedField<unsigned_int>::Swap
            ((RepeatedField<unsigned_int> *)data,(RepeatedField<unsigned_int> *)other_data);
  return;
}

Assistant:

virtual void Swap(
      Field* data,
      const internal::RepeatedFieldAccessor* other_mutator,
      Field* other_data) const {
    // Currently RepeatedFieldPrimitiveAccessor is the only implementation of
    // RepeatedFieldAccessor for primitive types. As we are using singletons
    // for these accessors, here "other_mutator" must be "this".
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }